

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O0

LinearIndex * __thiscall
CoreML::Specification::NearestNeighborsIndex::mutable_linearindex(NearestNeighborsIndex *this)

{
  bool bVar1;
  LinearIndex *this_00;
  NearestNeighborsIndex *this_local;
  
  bVar1 = has_linearindex(this);
  if (!bVar1) {
    clear_IndexType(this);
    set_has_linearindex(this);
    this_00 = (LinearIndex *)operator_new(0x18);
    LinearIndex::LinearIndex(this_00);
    (this->IndexType_).linearindex_ = this_00;
  }
  return (this->IndexType_).linearindex_;
}

Assistant:

inline ::CoreML::Specification::LinearIndex* NearestNeighborsIndex::mutable_linearindex() {
  if (!has_linearindex()) {
    clear_IndexType();
    set_has_linearindex();
    IndexType_.linearindex_ = new ::CoreML::Specification::LinearIndex;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NearestNeighborsIndex.linearIndex)
  return IndexType_.linearindex_;
}